

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cc
# Opt level: O1

char * Player::name(Player_Type pt)

{
  if (pt == OPL3) {
    return "ADLMIDI";
  }
  if (pt == OPN2) {
    return "OPNMIDI";
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/sources/player.cc"
                ,0x1d,"static const char *Player::name(Player_Type)");
}

Assistant:

const char *Player::name(Player_Type pt)
{
    switch (pt) {
    default: assert(false); abort();
    #define PLAYER_CASE(x)                                                  \
        case Player_Type::x: return Player_Traits<Player_Type::x>::name();
    EACH_PLAYER_TYPE(PLAYER_CASE);
    #undef PLAYER_CASE
    }
}